

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse2_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_table_diag_sse2_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  short sVar5;
  short sVar6;
  bool bVar7;
  short sVar8;
  bool bVar9;
  short sVar10;
  bool bVar11;
  short sVar12;
  unkbyte10 Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  short sVar19;
  int iVar20;
  uint uVar21;
  parasail_result_t *ppVar22;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  long lVar23;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  int iVar30;
  undefined8 unaff_RBX;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  int iVar37;
  uint uVar38;
  int iVar39;
  int16_t iVar40;
  uint uVar41;
  ulong uVar42;
  undefined4 uVar43;
  undefined1 auVar45 [16];
  undefined4 uVar44;
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  short local_248;
  short sStack_246;
  undefined1 local_238 [16];
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  short local_1a8;
  short sStack_1a6;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  long local_148;
  int *local_140;
  ulong local_138;
  ulong local_130;
  int *local_128;
  int *local_120;
  int *local_118;
  int *local_110;
  int *local_108;
  int *local_100;
  int *local_f8;
  int *local_f0;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  short sVar47;
  short sVar51;
  short sVar64;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_table_diag_sse2_128_16_cold_7();
    return (parasail_result_t *)0x0;
  }
  uVar42 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_sg_flags_table_diag_sse2_128_16_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_table_diag_sse2_128_16_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_table_diag_sse2_128_16_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_table_diag_sse2_128_16_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_table_diag_sse2_128_16_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_sg_flags_table_diag_sse2_128_16_cold_1();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    _s1Len = matrix->length;
  }
  iVar20 = _s1Len + 7;
  uVar31 = s2Len + 7;
  iVar37 = -open;
  iVar25 = matrix->min;
  iVar30 = -iVar25;
  if (iVar25 != iVar37 && SBORROW4(iVar25,iVar37) == iVar25 + open < 0) {
    iVar30 = open;
  }
  uVar35 = iVar30 - 0x7fff;
  iVar25 = matrix->max;
  auVar45 = pshuflw(ZEXT416(uVar35),ZEXT416(uVar35),0);
  uVar43 = auVar45._0_4_;
  local_248 = auVar45._0_2_;
  sStack_246 = auVar45._2_2_;
  local_e8 = 0;
  local_1c8 = (undefined1  [16])0x0;
  if (s1_beg == 0) {
    auVar45 = pshuflw(ZEXT416((uint)(gap * 8)),ZEXT416((uint)(gap * 8)),0);
    local_e8 = auVar45._0_4_;
  }
  local_158._0_8_ = CONCAT26(sStack_246,CONCAT24(local_248,uVar43));
  local_158._8_8_ = CONCAT26(sStack_246,CONCAT24(local_248,uVar43));
  local_168._8_8_ = local_158._8_8_;
  local_168._0_8_ = local_158._0_8_;
  local_c8._8_8_ = local_158._8_8_;
  local_c8._0_8_ = local_158._0_8_;
  local_178._8_8_ = local_158._8_8_;
  local_178._0_8_ = local_158._0_8_;
  local_d8._8_8_ = local_158._8_8_;
  local_d8._0_8_ = local_158._0_8_;
  if (s1_beg == 0) {
    local_1c8._6_2_ = (short)(iVar37 + gap * -4);
    local_1c8._4_2_ = (short)(gap * 0xfffb - open);
    local_1c8._2_2_ = (short)(gap * 0xfffa - open);
    local_1c8._0_2_ = (short)(gap * 0xfff9 - open);
    local_1c8._10_2_ = (short)(iVar37 + gap * -2);
    local_1c8._8_2_ = (short)(gap * 0xfffd - open);
    local_1c8._14_2_ = (short)iVar37;
    local_1c8._12_2_ = (short)(iVar37 - gap);
  }
  uStack_e4 = local_e8;
  uStack_e0 = local_e8;
  uStack_dc = local_e8;
  ppVar22 = parasail_result_new_table1(_s1Len,s2Len);
  if (ppVar22 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar22->flag =
       (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
       (uint)(s2_end != 0) << 0xf | ppVar22->flag | 0x8221002;
  uVar28 = (ulong)(s2Len + 0xe);
  ptr = parasail_memalign_int16_t(0x10,uVar28);
  ptr_00 = parasail_memalign_int16_t(0x10,uVar28);
  ptr_01 = parasail_memalign_int16_t(0x10,uVar28);
  if (ptr_01 == (int16_t *)0x0 || (ptr_00 == (int16_t *)0x0 || ptr == (int16_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    ptr_02 = parasail_memalign_int16_t(0x10,(long)iVar20);
    if (ptr_02 == (int16_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    if (0 < _s1Len) {
      piVar1 = matrix->mapper;
      uVar28 = 0;
      do {
        ptr_02[uVar28] = (int16_t)piVar1[(byte)_s1[uVar28]];
        uVar28 = uVar28 + 1;
      } while ((uint)_s1Len != uVar28);
    }
    iVar30 = _s1Len + 1U;
    if ((int)(_s1Len + 1U) < iVar20) {
      iVar30 = iVar20;
    }
    memset(ptr_02 + _s1Len,0,(ulong)(uint)(~_s1Len + iVar30) * 2 + 2);
  }
  else {
    ptr_02 = (int16_t *)0x0;
  }
  auVar45 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_RBX >> 0x10),0x7ffe - (short)iVar25));
  auVar45 = pshuflw(auVar45,auVar45,0);
  auVar48 = pshuflw(ZEXT416((uint)_s1Len),ZEXT416((uint)_s1Len),0);
  auVar52 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
  uVar44 = auVar45._0_4_;
  auVar78._0_8_ = CONCAT44(uVar44,uVar44);
  auVar78._8_4_ = uVar44;
  auVar78._12_4_ = uVar44;
  auVar46 = pshuflw(auVar78,ZEXT416((uint)open),0);
  auVar53 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)gap),0);
  local_58._0_4_ = auVar48._0_4_;
  local_58._4_4_ = local_58._0_4_;
  local_58._8_4_ = local_58._0_4_;
  local_58._12_4_ = local_58._0_4_;
  auVar48._8_4_ = 0xffffffff;
  auVar48._0_8_ = 0xffffffffffffffff;
  auVar48._12_4_ = 0xffffffff;
  local_78._0_4_ = auVar52._0_4_;
  local_78._4_4_ = local_78._0_4_;
  local_78._8_4_ = local_78._0_4_;
  local_78._12_4_ = local_78._0_4_;
  local_88 = auVar46._0_4_;
  local_98 = auVar53._0_4_;
  local_a8 = paddsw(local_58,auVar48);
  local_68 = paddsw(auVar48,local_78);
  piVar1 = matrix->mapper;
  uVar28 = 0;
  do {
    ptr[uVar28 + 7] = (int16_t)piVar1[(byte)_s2[uVar28]];
    uVar28 = uVar28 + 1;
  } while (uVar42 != uVar28);
  ptr[3] = 0;
  ptr[4] = 0;
  ptr[5] = 0;
  ptr[6] = 0;
  ptr[0] = 0;
  ptr[1] = 0;
  ptr[2] = 0;
  ptr[3] = 0;
  uVar26 = s2Len + 1U;
  if ((int)(s2Len + 1U) < (int)uVar31) {
    uVar26 = uVar31;
  }
  uStack_94 = local_98;
  uStack_90 = local_98;
  uStack_8c = local_98;
  uStack_84 = local_88;
  uStack_80 = local_88;
  uStack_7c = local_88;
  memset(ptr + uVar42 + 7,0,(ulong)(~s2Len + uVar26) * 2 + 2);
  uVar28 = 0;
  iVar40 = (int16_t)uVar35;
  iVar25 = iVar37;
  if (s2_beg == 0) {
    do {
      ptr_00[uVar28 + 7] = (int16_t)iVar25;
      ptr_01[uVar28 + 7] = iVar40;
      uVar28 = uVar28 + 1;
      iVar25 = iVar25 - gap;
    } while (uVar42 != uVar28);
  }
  else {
    do {
      ptr_00[uVar28 + 7] = 0;
      ptr_01[uVar28 + 7] = iVar40;
      uVar28 = uVar28 + 1;
    } while (uVar42 != uVar28);
  }
  lVar23 = 0;
  do {
    ptr_00[lVar23] = iVar40;
    ptr_01[lVar23] = iVar40;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 7);
  lVar23 = uVar42 + 7;
  uVar28 = uVar42;
  do {
    ptr_00[lVar23] = iVar40;
    ptr_01[lVar23] = iVar40;
    lVar23 = lVar23 + 1;
    uVar26 = (int)uVar28 + 1;
    uVar28 = (ulong)uVar26;
  } while ((int)uVar26 < (int)uVar31);
  ptr_00[6] = 0;
  local_1a8 = auVar45._0_2_;
  sStack_1a6 = auVar45._2_2_;
  if (_s1Len < 1) {
    local_c8._4_2_ = local_248;
    local_c8._0_4_ = uVar43;
    local_c8._6_2_ = sStack_246;
    local_c8._8_2_ = local_248;
    local_c8._10_2_ = sStack_246;
    local_c8._12_2_ = local_248;
    local_c8._14_2_ = sStack_246;
    local_188 = local_c8;
    local_d8 = local_c8;
    local_178 = local_c8;
    local_198._0_2_ = local_1a8;
    local_198._2_2_ = sStack_1a6;
    local_198._4_2_ = local_1a8;
    local_198._6_2_ = sStack_1a6;
    uStack_190._0_2_ = local_1a8;
    uStack_190._2_2_ = sStack_1a6;
    uStack_190._4_2_ = local_1a8;
    uStack_190._6_2_ = sStack_1a6;
  }
  else {
    local_140 = matrix->matrix;
    uVar26 = _s1Len - 1;
    Var13 = CONCAT28(local_248,CONCAT26(sStack_246,CONCAT24(local_248,uVar43)));
    auVar45._10_2_ = sStack_246;
    auVar45._0_10_ = Var13;
    auVar45._12_2_ = local_248;
    auVar45._14_2_ = sStack_246;
    local_130 = 1;
    if (1 < (int)uVar31) {
      local_130 = (ulong)uVar31;
    }
    local_b8 = auVar45 >> 0x10;
    auVar46 = local_b8;
    uVar33 = (ulong)(uint)_s1Len;
    local_1d0 = uVar42 * 0x1c + -0x1c;
    local_148 = uVar42 * 0x20;
    local_1d8 = uVar42 * 4 + -4;
    local_1e8 = uVar42 * 0x18 + -0x18;
    local_1f0 = uVar42 * 0x14 + -0x14;
    local_1f8 = uVar42 * 8 + -8;
    local_200 = uVar42 * 0x10 + -0x10;
    local_208 = uVar42 * 0xc + -0xc;
    local_238._8_8_ = 0x100020003;
    local_238._0_8_ = 0x4000500060007;
    local_1e0 = 0;
    uStack_1a0 = auVar78._8_8_;
    uStack_190 = uStack_1a0;
    uVar28 = 0;
    local_c8 = auVar45;
    local_d8 = auVar45;
    local_178 = auVar45;
    local_198 = auVar78._0_8_;
    local_188 = auVar45;
    do {
      uVar31 = (uint)uVar28;
      if (matrix->type == 0) {
        uVar21 = (uint)ptr_02[uVar28 + 1];
        uVar27 = (uint)ptr_02[uVar28 + 2];
        uVar34 = (uint)ptr_02[uVar28 + 3];
        uVar29 = (uint)ptr_02[uVar28 + 4];
        uVar38 = (uint)ptr_02[uVar28 + 5];
        uVar36 = (uint)ptr_02[uVar28 + 6];
        uVar32 = (int)ptr_02[uVar28];
        uVar41 = (int)ptr_02[uVar28 + 7];
      }
      else {
        uVar21 = uVar31 | 1;
        if (uVar33 <= (uVar28 | 1)) {
          uVar21 = uVar26;
        }
        uVar27 = uVar31 | 2;
        if (uVar33 <= (uVar28 | 2)) {
          uVar27 = uVar26;
        }
        uVar34 = uVar31 | 3;
        if (uVar33 <= (uVar28 | 3)) {
          uVar34 = uVar26;
        }
        uVar29 = uVar31 | 4;
        if (uVar33 <= (uVar28 | 4)) {
          uVar29 = uVar26;
        }
        uVar38 = uVar31 | 5;
        if (uVar33 <= (uVar28 | 5)) {
          uVar38 = uVar26;
        }
        uVar36 = uVar31 | 6;
        if (uVar33 <= (uVar28 | 6)) {
          uVar36 = uVar26;
        }
        uVar32 = uVar31;
        uVar41 = uVar31 | 7;
        if (uVar33 <= (uVar28 | 7)) {
          uVar41 = uVar26;
        }
      }
      iVar25 = matrix->size;
      local_138 = uVar28 + 8;
      local_f0 = local_140 + (int)(uVar38 * iVar25);
      local_f8 = local_140 + (int)(uVar34 * iVar25);
      local_100 = local_140 + (int)(uVar21 * iVar25);
      local_108 = local_140 + (int)(uVar32 * iVar25);
      local_110 = local_140 + (int)(uVar27 * iVar25);
      local_118 = local_140 + (int)(uVar29 * iVar25);
      local_120 = local_140 + (int)(uVar36 * iVar25);
      local_b8._0_8_ = (undefined8)((unkuint10)Var13 >> 0x10);
      local_b8._8_8_ = auVar45._8_8_ >> 0x10;
      auVar52._8_8_ = local_b8._8_8_ | (ulong)(ushort)ptr_00[6] << 0x30;
      auVar52._0_8_ = local_b8._0_8_;
      uVar31 = iVar37 - uVar31 * gap;
      if (s1_beg != 0) {
        uVar31 = 0;
      }
      local_128 = local_140 + (int)(uVar41 * iVar25);
      auVar82._8_8_ = local_b8._8_8_ | (ulong)uVar31 << 0x30;
      auVar82._0_8_ = local_b8._0_8_;
      ptr_00[6] = (short)iVar37 - (short)local_138 * (short)gap;
      local_48 = -(ushort)(local_a8._0_2_ == local_238._0_2_);
      sStack_46 = -(ushort)(local_a8._2_2_ == local_238._2_2_);
      sStack_44 = -(ushort)(local_a8._4_2_ == local_238._4_2_);
      sStack_42 = -(ushort)(local_a8._6_2_ == local_238._6_2_);
      sStack_40 = -(ushort)(local_a8._8_2_ == local_238._8_2_);
      sStack_3e = -(ushort)(local_a8._10_2_ == local_238._10_2_);
      sStack_3c = -(ushort)(local_a8._12_2_ == local_238._12_2_);
      sStack_3a = -(ushort)(local_a8._14_2_ == local_238._14_2_);
      auVar53._4_2_ = local_248;
      auVar53._0_4_ = uVar43;
      auVar53._6_2_ = sStack_246;
      auVar53._8_2_ = local_248;
      auVar53._10_2_ = sStack_246;
      auVar53._12_2_ = local_248;
      auVar53._14_2_ = sStack_246;
      uVar24 = 0;
      auVar78 = _DAT_00904d00;
      auVar48 = auVar53;
      do {
        auVar63._14_2_ = (short)(local_140 + (int)(uVar32 * iVar25))[ptr[uVar24 + 7]];
        auVar63._12_2_ = (short)(local_140 + (int)(uVar21 * iVar25))[ptr[uVar24 + 6]];
        auVar63._10_2_ = (short)(local_140 + (int)(uVar27 * iVar25))[ptr[uVar24 + 5]];
        auVar63._8_2_ = (short)(local_140 + (int)(uVar34 * iVar25))[ptr[uVar24 + 4]];
        auVar63._6_2_ = (short)(local_140 + (int)(uVar29 * iVar25))[ptr[uVar24 + 3]];
        auVar63._4_2_ = (short)(local_140 + (int)(uVar38 * iVar25))[ptr[uVar24 + 2]];
        auVar63._0_2_ = (undefined2)(local_140 + (int)(uVar41 * iVar25))[ptr[uVar24]];
        auVar63._2_2_ = (short)(local_140 + (int)(uVar36 * iVar25))[ptr[uVar24 + 1]];
        auVar81._0_8_ = auVar82._2_8_;
        auVar81._8_8_ = auVar82._8_8_ >> 0x10 | (ulong)(ushort)ptr_00[uVar24 + 7] << 0x30;
        auVar76._0_8_ = auVar53._2_8_;
        auVar76._8_8_ = auVar53._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar24 + 7] << 0x30;
        auVar53 = paddsw(auVar63,auVar52);
        auVar17._4_4_ = uStack_84;
        auVar17._0_4_ = local_88;
        auVar17._8_4_ = uStack_80;
        auVar17._12_4_ = uStack_7c;
        auVar52 = psubsw(auVar81,auVar17);
        auVar16._4_4_ = uStack_94;
        auVar16._0_4_ = local_98;
        auVar16._8_4_ = uStack_90;
        auVar16._12_4_ = uStack_8c;
        auVar77 = psubsw(auVar76,auVar16);
        sVar19 = auVar52._0_2_;
        sVar47 = auVar77._0_2_;
        auVar49._0_2_ = (ushort)(sVar47 < sVar19) * sVar19 | (ushort)(sVar47 >= sVar19) * sVar47;
        sVar19 = auVar52._2_2_;
        sVar47 = auVar77._2_2_;
        auVar49._2_2_ = (ushort)(sVar47 < sVar19) * sVar19 | (ushort)(sVar47 >= sVar19) * sVar47;
        sVar19 = auVar52._4_2_;
        sVar47 = auVar77._4_2_;
        auVar49._4_2_ = (ushort)(sVar47 < sVar19) * sVar19 | (ushort)(sVar47 >= sVar19) * sVar47;
        sVar19 = auVar52._6_2_;
        sVar47 = auVar77._6_2_;
        auVar49._6_2_ = (ushort)(sVar47 < sVar19) * sVar19 | (ushort)(sVar47 >= sVar19) * sVar47;
        sVar19 = auVar52._8_2_;
        sVar47 = auVar77._8_2_;
        auVar49._8_2_ = (ushort)(sVar47 < sVar19) * sVar19 | (ushort)(sVar47 >= sVar19) * sVar47;
        sVar19 = auVar52._10_2_;
        sVar47 = auVar77._10_2_;
        auVar49._10_2_ = (ushort)(sVar47 < sVar19) * sVar19 | (ushort)(sVar47 >= sVar19) * sVar47;
        sVar19 = auVar52._12_2_;
        sVar47 = auVar77._12_2_;
        sVar51 = auVar77._14_2_;
        auVar49._12_2_ = (ushort)(sVar47 < sVar19) * sVar19 | (ushort)(sVar47 >= sVar19) * sVar47;
        sVar19 = auVar52._14_2_;
        auVar49._14_2_ = (ushort)(sVar51 < sVar19) * sVar19 | (ushort)(sVar51 >= sVar19) * sVar51;
        auVar52 = psubsw(auVar82,auVar17);
        auVar48 = psubsw(auVar48,auVar16);
        sVar19 = auVar52._0_2_;
        sVar47 = auVar48._0_2_;
        auVar79._0_2_ = (ushort)(sVar47 < sVar19) * sVar19 | (ushort)(sVar47 >= sVar19) * sVar47;
        sVar19 = auVar52._2_2_;
        sVar47 = auVar48._2_2_;
        auVar79._2_2_ = (ushort)(sVar47 < sVar19) * sVar19 | (ushort)(sVar47 >= sVar19) * sVar47;
        sVar19 = auVar52._4_2_;
        sVar47 = auVar48._4_2_;
        auVar79._4_2_ = (ushort)(sVar47 < sVar19) * sVar19 | (ushort)(sVar47 >= sVar19) * sVar47;
        sVar19 = auVar52._6_2_;
        sVar47 = auVar48._6_2_;
        auVar79._6_2_ = (ushort)(sVar47 < sVar19) * sVar19 | (ushort)(sVar47 >= sVar19) * sVar47;
        sVar19 = auVar52._8_2_;
        sVar47 = auVar48._8_2_;
        auVar79._8_2_ = (ushort)(sVar47 < sVar19) * sVar19 | (ushort)(sVar47 >= sVar19) * sVar47;
        sVar19 = auVar52._10_2_;
        sVar47 = auVar48._10_2_;
        auVar79._10_2_ = (ushort)(sVar47 < sVar19) * sVar19 | (ushort)(sVar47 >= sVar19) * sVar47;
        sVar19 = auVar52._12_2_;
        sVar47 = auVar48._12_2_;
        sVar51 = auVar48._14_2_;
        auVar79._12_2_ = (ushort)(sVar47 < sVar19) * sVar19 | (ushort)(sVar47 >= sVar19) * sVar47;
        sVar19 = auVar52._14_2_;
        auVar79._14_2_ = (ushort)(sVar51 < sVar19) * sVar19 | (ushort)(sVar51 >= sVar19) * sVar51;
        uVar54 = ((short)auVar79._0_2_ < (short)auVar49._0_2_) * auVar49._0_2_ |
                 ((short)auVar79._0_2_ >= (short)auVar49._0_2_) * auVar79._0_2_;
        uVar55 = ((short)auVar79._2_2_ < (short)auVar49._2_2_) * auVar49._2_2_ |
                 ((short)auVar79._2_2_ >= (short)auVar49._2_2_) * auVar79._2_2_;
        uVar56 = ((short)auVar79._4_2_ < (short)auVar49._4_2_) * auVar49._4_2_ |
                 ((short)auVar79._4_2_ >= (short)auVar49._4_2_) * auVar79._4_2_;
        uVar57 = ((short)auVar79._6_2_ < (short)auVar49._6_2_) * auVar49._6_2_ |
                 ((short)auVar79._6_2_ >= (short)auVar49._6_2_) * auVar79._6_2_;
        uVar58 = ((short)auVar79._8_2_ < (short)auVar49._8_2_) * auVar49._8_2_ |
                 ((short)auVar79._8_2_ >= (short)auVar49._8_2_) * auVar79._8_2_;
        uVar59 = ((short)auVar79._10_2_ < (short)auVar49._10_2_) * auVar49._10_2_ |
                 ((short)auVar79._10_2_ >= (short)auVar49._10_2_) * auVar79._10_2_;
        uVar60 = ((short)auVar79._12_2_ < (short)auVar49._12_2_) * auVar49._12_2_ |
                 ((short)auVar79._12_2_ >= (short)auVar49._12_2_) * auVar79._12_2_;
        uVar61 = ((short)auVar79._14_2_ < (short)auVar49._14_2_) * auVar49._14_2_ |
                 ((short)auVar79._14_2_ >= (short)auVar49._14_2_) * auVar79._14_2_;
        sVar19 = auVar53._0_2_;
        auVar77._0_2_ =
             (ushort)((short)uVar54 < sVar19) * sVar19 | ((short)uVar54 >= sVar19) * uVar54;
        sVar19 = auVar53._2_2_;
        auVar77._2_2_ =
             (ushort)((short)uVar55 < sVar19) * sVar19 | ((short)uVar55 >= sVar19) * uVar55;
        sVar19 = auVar53._4_2_;
        auVar77._4_2_ =
             (ushort)((short)uVar56 < sVar19) * sVar19 | ((short)uVar56 >= sVar19) * uVar56;
        sVar19 = auVar53._6_2_;
        auVar77._6_2_ =
             (ushort)((short)uVar57 < sVar19) * sVar19 | ((short)uVar57 >= sVar19) * uVar57;
        sVar19 = auVar53._8_2_;
        auVar77._8_2_ =
             (ushort)((short)uVar58 < sVar19) * sVar19 | ((short)uVar58 >= sVar19) * uVar58;
        sVar19 = auVar53._10_2_;
        auVar77._10_2_ =
             (ushort)((short)uVar59 < sVar19) * sVar19 | ((short)uVar59 >= sVar19) * uVar59;
        sVar19 = auVar53._12_2_;
        auVar77._12_2_ =
             (ushort)((short)uVar60 < sVar19) * sVar19 | ((short)uVar60 >= sVar19) * uVar60;
        sVar19 = auVar53._14_2_;
        auVar77._14_2_ =
             (ushort)((short)uVar61 < sVar19) * sVar19 | ((short)uVar61 >= sVar19) * uVar61;
        sVar64 = auVar78._0_2_;
        auVar65._0_2_ = -(ushort)(sVar64 == -1);
        sVar68 = auVar78._2_2_;
        auVar65._2_2_ = -(ushort)(sVar68 == -1);
        sVar69 = auVar78._4_2_;
        auVar65._4_2_ = -(ushort)(sVar69 == -1);
        sVar70 = auVar78._6_2_;
        auVar65._6_2_ = -(ushort)(sVar70 == -1);
        sVar71 = auVar78._8_2_;
        auVar65._8_2_ = -(ushort)(sVar71 == -1);
        sVar72 = auVar78._10_2_;
        auVar65._10_2_ = -(ushort)(sVar72 == -1);
        sVar73 = auVar78._12_2_;
        sVar74 = auVar78._14_2_;
        auVar65._12_2_ = -(ushort)(sVar73 == -1);
        auVar65._14_2_ = -(ushort)(sVar74 == -1);
        auVar82 = local_1c8 & auVar65 | ~auVar65 & auVar77;
        sVar19 = auVar82._0_2_;
        sVar47 = auVar82._2_2_;
        sVar12 = auVar82._14_2_;
        sVar6 = auVar82._8_2_;
        sVar8 = auVar82._10_2_;
        sVar10 = auVar82._12_2_;
        sVar51 = auVar82._4_2_;
        sVar5 = auVar82._6_2_;
        if (7 < uVar24) {
          bVar2 = sVar19 < (short)local_198;
          uVar54 = (ushort)!bVar2 * (short)local_198;
          bVar3 = sVar47 < local_198._2_2_;
          uVar55 = (ushort)!bVar3 * local_198._2_2_;
          bVar4 = sVar51 < local_198._4_2_;
          uVar56 = (ushort)!bVar4 * local_198._4_2_;
          bVar7 = sVar6 < (short)uStack_190;
          uVar57 = (ushort)!bVar7 * (short)uStack_190;
          bVar9 = sVar8 < uStack_190._2_2_;
          uVar58 = (ushort)!bVar9 * uStack_190._2_2_;
          bVar11 = sVar10 < uStack_190._4_2_;
          uVar59 = (ushort)!bVar11 * uStack_190._4_2_;
          local_198 = CONCAT26((ushort)(sVar5 < local_198._6_2_) * sVar5 |
                               (ushort)(sVar5 >= local_198._6_2_) * local_198._6_2_,
                               CONCAT24((ushort)bVar4 * sVar51 | uVar56,
                                        CONCAT22((ushort)bVar3 * sVar47 | uVar55,
                                                 (ushort)bVar2 * sVar19 | uVar54)));
          uStack_190 = CONCAT26((ushort)(sVar12 < uStack_190._6_2_) * sVar12 |
                                (ushort)(sVar12 >= uStack_190._6_2_) * uStack_190._6_2_,
                                CONCAT24((ushort)bVar11 * sVar10 | uVar59,
                                         CONCAT22((ushort)bVar9 * sVar8 | uVar58,
                                                  (ushort)bVar7 * sVar6 | uVar57)));
          local_188._2_2_ =
               (ushort)((short)local_188._2_2_ < sVar47) * sVar47 |
               (ushort)((short)local_188._2_2_ >= sVar47) * local_188._2_2_;
          local_188._0_2_ =
               (ushort)((short)local_188._0_2_ < sVar19) * sVar19 |
               (ushort)((short)local_188._0_2_ >= sVar19) * local_188._0_2_;
          local_188._4_2_ =
               (ushort)((short)local_188._4_2_ < sVar51) * sVar51 |
               (ushort)((short)local_188._4_2_ >= sVar51) * local_188._4_2_;
          local_188._6_2_ =
               (ushort)((short)local_188._6_2_ < sVar5) * sVar5 |
               (ushort)((short)local_188._6_2_ >= sVar5) * local_188._6_2_;
          local_188._8_2_ =
               (ushort)((short)local_188._8_2_ < sVar6) * sVar6 |
               (ushort)((short)local_188._8_2_ >= sVar6) * local_188._8_2_;
          local_188._10_2_ =
               (ushort)((short)local_188._10_2_ < sVar8) * sVar8 |
               (ushort)((short)local_188._10_2_ >= sVar8) * local_188._10_2_;
          local_188._12_2_ =
               (ushort)((short)local_188._12_2_ < sVar10) * sVar10 |
               (ushort)((short)local_188._12_2_ >= sVar10) * local_188._12_2_;
          local_188._14_2_ =
               (ushort)((short)local_188._14_2_ < sVar12) * sVar12 |
               (ushort)((short)local_188._14_2_ >= sVar12) * local_188._14_2_;
        }
        piVar1 = ((ppVar22->field_4).rowcols)->score_row;
        if (uVar24 < uVar42) {
          *(int *)((long)piVar1 + uVar24 * 4 + local_1e0) = (int)sVar12;
        }
        if (uVar24 - 1 < uVar42 && (uVar28 | 1) < uVar33) {
          *(int *)((long)piVar1 + uVar24 * 4 + local_1d8) = (int)sVar10;
        }
        if (((uVar28 | 2) < uVar33) && ((long)(uVar24 - 2) < (long)uVar42 && 1 < uVar24)) {
          *(int *)((long)piVar1 + uVar24 * 4 + local_1f8) = (int)sVar8;
        }
        if (((uVar28 | 3) < uVar33) && ((long)(uVar24 - 3) < (long)uVar42 && 2 < uVar24)) {
          *(int *)((long)piVar1 + uVar24 * 4 + local_208) = (int)sVar6;
        }
        if (((uVar28 | 4) < uVar33) && ((long)(uVar24 - 4) < (long)uVar42 && 3 < uVar24)) {
          *(int *)((long)piVar1 + uVar24 * 4 + local_200) = (int)sVar5;
        }
        if (((uVar28 | 5) < uVar33) && ((long)(uVar24 - 5) < (long)uVar42 && 4 < uVar24)) {
          *(int *)((long)piVar1 + uVar24 * 4 + local_1f0) = (int)sVar51;
        }
        if (((uVar28 | 6) < uVar33) && ((long)(uVar24 - 6) < (long)uVar42 && 5 < uVar24)) {
          *(int *)((long)piVar1 + uVar24 * 4 + local_1e8) = (int)sVar47;
        }
        auVar14._4_2_ = local_248;
        auVar14._0_4_ = uVar43;
        auVar14._6_2_ = sStack_246;
        auVar14._8_2_ = local_248;
        auVar14._10_2_ = sStack_246;
        auVar14._12_2_ = local_248;
        auVar14._14_2_ = sStack_246;
        auVar53 = ~auVar65 & auVar49 | auVar14 & auVar65;
        if (6 < uVar24 && (uVar28 | 7) < uVar33) {
          *(int *)((long)piVar1 + uVar24 * 4 + local_1d0) = (int)sVar19;
        }
        auVar48 = auVar14 & auVar65 | ~auVar65 & auVar79;
        auVar66._0_2_ = -(ushort)((short)local_238._0_2_ < (short)local_58._0_2_);
        auVar66._2_2_ = -(ushort)((short)local_238._2_2_ < (short)local_58._2_2_);
        auVar66._4_2_ = -(ushort)((short)local_238._4_2_ < (short)local_58._4_2_);
        auVar66._6_2_ = -(ushort)((short)local_238._6_2_ < (short)local_58._6_2_);
        auVar66._8_2_ = -(ushort)((short)local_238._8_2_ < (short)local_58._8_2_);
        auVar66._10_2_ = -(ushort)((short)local_238._10_2_ < (short)local_58._10_2_);
        auVar66._12_2_ = -(ushort)((short)local_238._12_2_ < (short)local_58._12_2_);
        auVar66._14_2_ = -(ushort)((short)local_238._14_2_ < (short)local_58._14_2_);
        auVar75._0_2_ = -(ushort)(local_68._0_2_ == sVar64);
        auVar75._2_2_ = -(ushort)(local_68._2_2_ == sVar68);
        auVar75._4_2_ = -(ushort)(local_68._4_2_ == sVar69);
        auVar75._6_2_ = -(ushort)(local_68._6_2_ == sVar70);
        auVar75._8_2_ = -(ushort)(local_68._8_2_ == sVar71);
        auVar75._10_2_ = -(ushort)(local_68._10_2_ == sVar72);
        auVar75._12_2_ = -(ushort)(local_68._12_2_ == sVar73);
        auVar75._14_2_ = -(ushort)(local_68._14_2_ == sVar74);
        auVar62._0_2_ = -(ushort)(sVar64 < (short)local_78._0_2_);
        auVar62._2_2_ = -(ushort)(sVar68 < (short)local_78._2_2_);
        auVar62._4_2_ = -(ushort)(sVar69 < (short)local_78._4_2_);
        auVar62._6_2_ = -(ushort)(sVar70 < (short)local_78._6_2_);
        auVar62._8_2_ = -(ushort)(sVar71 < (short)local_78._8_2_);
        auVar62._10_2_ = -(ushort)(sVar72 < (short)local_78._10_2_);
        auVar62._12_2_ = -(ushort)(sVar73 < (short)local_78._12_2_);
        auVar62._14_2_ = -(ushort)(sVar74 < (short)local_78._14_2_);
        auVar52 = psraw(auVar78,0xf);
        auVar80._0_2_ = -(ushort)(local_158._0_2_ < sVar19);
        auVar80._2_2_ = -(ushort)(local_158._2_2_ < sVar47);
        auVar80._4_2_ = -(ushort)(local_158._4_2_ < sVar51);
        auVar80._6_2_ = -(ushort)(local_158._6_2_ < sVar5);
        auVar80._8_2_ = -(ushort)(local_158._8_2_ < sVar6);
        auVar80._10_2_ = -(ushort)(local_158._10_2_ < sVar8);
        auVar80._12_2_ = -(ushort)(local_158._12_2_ < sVar10);
        auVar80._14_2_ = -(ushort)(local_158._14_2_ < sVar12);
        auVar18._2_2_ = -(ushort)(local_a8._2_2_ == local_238._2_2_);
        auVar18._0_2_ = -(ushort)(local_a8._0_2_ == local_238._0_2_);
        auVar18._4_2_ = -(ushort)(local_a8._4_2_ == local_238._4_2_);
        auVar18._6_2_ = -(ushort)(local_a8._6_2_ == local_238._6_2_);
        auVar18._8_2_ = -(ushort)(local_a8._8_2_ == local_238._8_2_);
        auVar18._10_2_ = -(ushort)(local_a8._10_2_ == local_238._10_2_);
        auVar18._12_2_ = -(ushort)(local_a8._12_2_ == local_238._12_2_);
        auVar18._14_2_ = -(ushort)(local_a8._14_2_ == local_238._14_2_);
        auVar80 = ~auVar52 & auVar62 & auVar18 & auVar80;
        auVar67._0_2_ = -(ushort)(local_168._0_2_ < sVar19);
        auVar67._2_2_ = -(ushort)(local_168._2_2_ < sVar47);
        auVar67._4_2_ = -(ushort)(local_168._4_2_ < sVar51);
        auVar67._6_2_ = -(ushort)(local_168._6_2_ < sVar5);
        auVar67._8_2_ = -(ushort)(local_168._8_2_ < sVar6);
        auVar67._10_2_ = -(ushort)(local_168._10_2_ < sVar8);
        auVar67._12_2_ = -(ushort)(local_168._12_2_ < sVar10);
        auVar67._14_2_ = -(ushort)(local_168._14_2_ < sVar12);
        auVar67 = auVar66 & auVar75 & auVar67;
        local_158 = auVar77 & auVar80 | ~auVar80 & local_158;
        local_168 = auVar82 & auVar67 | ~auVar67 & local_168;
        local_c8 = ~(auVar75 & auVar18) & local_c8 | auVar82 & auVar75 & auVar18;
        local_178 = ~auVar67 & local_178 | local_238 & auVar67;
        local_d8 = ~auVar80 & local_d8 | auVar78 & auVar80;
        ptr_00[uVar24] = sVar19;
        ptr_01[uVar24] = auVar53._0_2_;
        auVar78 = paddsw(auVar78,_DAT_00904d10);
        uVar24 = uVar24 + 1;
        auVar52 = auVar81;
      } while (local_130 != uVar24);
      local_238 = paddsw(local_238,_DAT_00904d20);
      auVar15._4_4_ = uStack_e4;
      auVar15._0_4_ = local_e8;
      auVar15._8_4_ = uStack_e0;
      auVar15._12_4_ = uStack_dc;
      local_1c8 = psubsw(local_1c8,auVar15);
      local_1d0 = local_1d0 + local_148;
      local_1e0 = local_1e0 + local_148;
      local_1d8 = local_1d8 + local_148;
      local_1e8 = local_1e8 + local_148;
      local_1f0 = local_1f0 + local_148;
      local_200 = local_200 + local_148;
      local_208 = local_208 + local_148;
      local_1f8 = local_1f8 + local_148;
      uVar28 = local_138;
    } while (local_138 < uVar33);
    local_b8 = auVar46;
  }
  lVar23 = 0;
  iVar30 = 0;
  iVar20 = 0;
  iVar25 = 0;
  uVar31 = uVar35;
  uVar26 = uVar35;
  do {
    uVar54 = *(ushort *)(local_168 + lVar23 * 2);
    if ((short)(ushort)uVar31 < (short)uVar54) {
      iVar37 = (int)*(short *)(local_178 + lVar23 * 2);
      iVar30 = (int)*(short *)(local_178 + lVar23 * 2);
      uVar31 = (uint)uVar54;
    }
    else {
      iVar37 = iVar25;
      if (uVar54 == (ushort)uVar31) {
        iVar39 = (int)*(short *)(local_178 + lVar23 * 2);
        iVar37 = iVar30;
        if (iVar39 <= iVar25) {
          iVar37 = iVar39;
        }
        iVar30 = iVar37;
        if (iVar39 < iVar25) {
          uVar31 = (uint)uVar54;
        }
      }
    }
    sVar19 = (short)uVar31;
    if ((short)uVar26 < (short)*(ushort *)(local_158 + lVar23 * 2)) {
      iVar20 = (int)*(short *)(local_d8 + lVar23 * 2);
      uVar26 = (uint)*(ushort *)(local_158 + lVar23 * 2);
    }
    sVar47 = (short)uVar26;
    uVar32 = (uint)*(ushort *)(local_c8 + lVar23 * 2);
    if ((short)*(ushort *)(local_c8 + lVar23 * 2) <= (short)uVar35) {
      uVar32 = uVar35;
    }
    uVar35 = uVar32;
    lVar23 = lVar23 + 1;
    iVar25 = iVar37;
  } while ((int)lVar23 != 8);
  sVar51 = sVar47;
  iVar25 = iVar20;
  if (s1_end == 0 || s2_end == 0) {
    if (s1_end != 0) goto LAB_005ba8de;
    sVar51 = (short)uVar35;
    iVar25 = s2Len + -1;
    if (s2_end != 0) {
      sVar51 = sVar47;
      iVar25 = iVar20;
    }
  }
  else {
    if (sVar47 < sVar19) {
LAB_005ba8de:
      iVar30 = s2Len + -1;
      goto LAB_005ba93d;
    }
    if ((sVar19 == sVar47) && (iVar30 = s2Len + -1, iVar20 == s2Len + -1)) goto LAB_005ba93d;
  }
  sVar19 = sVar51;
  iVar37 = _s1Len - 1;
  iVar30 = iVar25;
LAB_005ba93d:
  auVar46._0_2_ = -(ushort)((short)local_198 < local_248);
  auVar46._2_2_ = -(ushort)(local_198._2_2_ < sStack_246);
  auVar46._4_2_ = -(ushort)(local_198._4_2_ < local_248);
  auVar46._6_2_ = -(ushort)(local_198._6_2_ < sStack_246);
  auVar46._8_2_ = -(ushort)((short)uStack_190 < local_248);
  auVar46._10_2_ = -(ushort)(uStack_190._2_2_ < sStack_246);
  auVar46._12_2_ = -(ushort)(uStack_190._4_2_ < local_248);
  auVar46._14_2_ = -(ushort)(uStack_190._6_2_ < sStack_246);
  auVar50._0_2_ = -(ushort)(local_1a8 < local_188._0_2_);
  auVar50._2_2_ = -(ushort)(sStack_1a6 < local_188._2_2_);
  auVar50._4_2_ = -(ushort)(local_1a8 < local_188._4_2_);
  auVar50._6_2_ = -(ushort)(sStack_1a6 < local_188._6_2_);
  auVar50._8_2_ = -(ushort)(local_1a8 < local_188._8_2_);
  auVar50._10_2_ = -(ushort)(sStack_1a6 < local_188._10_2_);
  auVar50._12_2_ = -(ushort)(local_1a8 < local_188._12_2_);
  auVar50._14_2_ = -(ushort)(sStack_1a6 < local_188._14_2_);
  auVar50 = auVar50 | auVar46;
  if ((((((((((((((((auVar50 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar50 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar50 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar50 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar50 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar50 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar50 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar50 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar50 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar50 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar50 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar50 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar50[0xf] < '\0') {
    *(byte *)&ppVar22->flag = (byte)ppVar22->flag | 0x40;
    sVar19 = 0;
    iVar30 = 0;
    iVar37 = 0;
  }
  ppVar22->score = (int)sVar19;
  ppVar22->end_query = iVar37;
  ppVar22->end_ref = iVar30;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(ptr_02);
    return ppVar22;
  }
  return ppVar22;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = s1_beg ? _mm_set1_epi16(0) : _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi16(0) : _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi16(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 2);
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_srli_si128(vWH, 2);
        vWH = _mm_insert_epi16(vWH, s1_beg ? 0 : (-open - i*gap), 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi16(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi16(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi16(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi16(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8_rpl(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8_rpl(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8_rpl(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int16_t max_row = NEG_LIMIT;
        int16_t max_col = NEG_LIMIT;
        int16_t last_val = NEG_LIMIT;
        int16_t *s = (int16_t*)&vMaxHRow;
        int16_t *t = (int16_t*)&vMaxHCol;
        int16_t *u = (int16_t*)&vLastVal;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}